

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_base_convert(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pValue;
  int iVar1;
  int iVar2;
  char **in_RCX;
  char *pcVar3;
  jx9_int64 iNum;
  int nLen;
  jx9_int64 local_30;
  sxu32 local_24;
  
  if (nArg < 3) {
LAB_0012a236:
    jx9_result_string(pCtx,"",0);
  }
  else {
    iVar1 = jx9_value_to_int(apArg[1]);
    iVar2 = jx9_value_to_int(apArg[2]);
    pValue = *apArg;
    if ((pValue->iFlags & 1) == 0) {
      local_30 = jx9_value_to_int64(pValue);
    }
    else {
      pcVar3 = jx9_value_to_string(pValue,(int *)&local_24);
      if ((int)local_24 < 1) goto LAB_0012a236;
      if (iVar1 == 2) {
        SyBinaryStrToInt64(pcVar3,local_24,&local_30,in_RCX);
      }
      else if (iVar1 == 8) {
        SyOctalStrToInt64(pcVar3,local_24,&local_30,in_RCX);
      }
      else if (iVar1 == 0x10) {
        SyHexStrToInt64(pcVar3,local_24,&local_30,in_RCX);
      }
      else {
        SyStrToInt64(pcVar3,local_24,&local_30,in_RCX);
      }
    }
    if (iVar2 == 2) {
      pcVar3 = "%qB";
    }
    else if (iVar2 == 8) {
      pcVar3 = "%qo";
    }
    else if (iVar2 == 0x10) {
      pcVar3 = "%qx";
    }
    else {
      pcVar3 = "%qd";
    }
    jx9_result_string_format(pCtx,pcVar3,local_30);
  }
  return 0;
}

Assistant:

static int jx9Builtin_base_convert(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int nLen, iFbase, iTobase;
	const char *zNum;
	jx9_int64 iNum;
	if( nArg < 3 ){
		/* Return the empty string*/
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Base numbers */
	iFbase  = jx9_value_to_int(apArg[1]);
	iTobase = jx9_value_to_int(apArg[2]);
	if( jx9_value_is_string(apArg[0]) ){
		/* Extract the target number */
		zNum = jx9_value_to_string(apArg[0], &nLen);
		if( nLen < 1 ){
			/* Return the empty string*/
			jx9_result_string(pCtx, "", 0);
			return JX9_OK;
		}
		/* Base conversion */
		switch(iFbase){
		case 16:
			/* Hex */
			SyHexStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		case 8:
			/* Octal */
			SyOctalStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		case 2:
			/* Binary */
			SyBinaryStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		default:
			/* Decimal */
			SyStrToInt64(zNum, (sxu32)nLen, (void *)&iNum, 0);
			break;
		}
	}else{
		iNum = jx9_value_to_int64(apArg[0]);
	}
	switch(iTobase){
	case 16:
		/* Hex */
		jx9_result_string_format(pCtx, "%qx", iNum); /* Quad hex */
		break;
	case 8:
		/* Octal */
		jx9_result_string_format(pCtx, "%qo", iNum); /* Quad octal */
		break;
	case 2:
		/* Binary */
		jx9_result_string_format(pCtx, "%qB", iNum); /* Quad binary */
		break;
	default:
		/* Decimal */
		jx9_result_string_format(pCtx, "%qd", iNum); /* Quad decimal */
		break;
	}
	return JX9_OK;
}